

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O0

TLASInstanceDesc __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  TLASInstanceDesc TVar1;
  undefined *puVar2;
  bool bVar3;
  Char *Message;
  pointer pvVar4;
  undefined8 uVar5;
  char (*in_RCX) [35];
  char (*in_R8) [3];
  undefined1 local_a0 [8];
  string _msg;
  InstanceDesc *Inst;
  HashMapStringKey local_70;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
  local_60;
  const_iterator Iter;
  undefined1 local_48 [8];
  string msg;
  char *Name_local;
  TopLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  TLASInstanceDesc Result;
  
  msg.field_2._8_8_ = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetInstanceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_48);
  }
  TLASInstanceDesc::TLASInstanceDesc((TLASInstanceDesc *)&this_local);
  HashMapStringKey::HashMapStringKey(&local_70,(Char *)msg.field_2._8_8_,false);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
       ::find(&this->m_Instances,&local_70);
  HashMapStringKey::~HashMapStringKey(&local_70);
  Inst = (InstanceDesc *)
         std::
         unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
         ::end(&this->m_Instances);
  bVar3 = std::__detail::operator!=
                    (&local_60,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false>
                      *)&Inst);
  if (bVar3) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>
                           *)&local_60);
    _msg.field_2._8_8_ = &pvVar4->second;
    this_local._0_4_ = ((InstanceDesc *)_msg.field_2._8_8_)->ContributionToHitGroupIndex;
    this_local._4_4_ = (pvVar4->second).InstanceIndex;
    Result._0_8_ = Diligent::RefCntAutoPtr::operator_cast_to_BottomLevelASVkImpl_
                             ((RefCntAutoPtr *)&(pvVar4->second).pBLAS);
  }
  else {
    this_local._0_4_ = 0xffffffff;
    this_local._4_4_ = 0xffffffff;
    FormatString<char[47],char_const*,char[3]>
              ((string *)local_a0,(Diligent *)"Can\'t find instance with the specified name (\'",
               (char (*) [47])((long)&msg.field_2 + 8),(char **)0xeea2ac,in_R8);
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(2,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  TVar1.InstanceIndex = this_local._4_4_;
  TVar1.ContributionToHitGroupIndex = (Uint32)this_local;
  TVar1.pBLAS = (IBottomLevelAS *)Result._0_8_;
  return TVar1;
}

Assistant:

GetInstanceDesc(const char* Name) const override final
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');

        TLASInstanceDesc Result = {};

        auto Iter = this->m_Instances.find(Name);
        if (Iter != this->m_Instances.end())
        {
            const auto& Inst                   = Iter->second;
            Result.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            Result.InstanceIndex               = Inst.InstanceIndex;
            Result.pBLAS                       = Inst.pBLAS;
        }
        else
        {
            Result.ContributionToHitGroupIndex = INVALID_INDEX;
            Result.InstanceIndex               = INVALID_INDEX;
            LOG_ERROR_MESSAGE("Can't find instance with the specified name ('", Name, "')");
        }

        return Result;
    }